

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

bool __thiscall Json::Value::isInt(Value *this)

{
  bool bVar1;
  byte bVar2;
  double *in_RDI;
  long val;
  Value *in_stack_000001a8;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  string *str;
  bool local_5a;
  bool local_59;
  string local_38 [32];
  long local_18;
  bool local_1;
  
  switch(*(undefined1 *)(in_RDI + 1)) {
  case 1:
  case 3:
    local_59 = false;
    if (-0x80000001 < (long)*in_RDI) {
      local_59 = (long)*in_RDI < 0x80000000;
    }
    local_1 = local_59;
    break;
  case 2:
    local_1 = (ulong)*in_RDI < 0x80000000;
    break;
  case 4:
    local_5a = false;
    if ((-2147483648.0 <= *in_RDI) && (local_5a = false, *in_RDI <= 2147483647.0)) {
      local_5a = IsIntegral((double)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
    }
    local_1 = local_5a;
    break;
  case 5:
    str = local_38;
    asString_abi_cxx11_(in_stack_000001a8);
    std::__cxx11::string::c_str();
    bVar1 = converToInt((char *)str,
                        (long *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
    bVar2 = bVar1 ^ 0xff;
    std::__cxx11::string::~string(local_38);
    if ((bVar2 & 1) == 0) {
      bVar1 = IsInRange<long,int,int>(local_18,-0x80000000,0x7fffffff);
      return bVar1;
    }
  default:
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Value::isInt() const {
  switch (type_) {
#if defined(JSON_HAS_INT64)
  case int64Value:
#endif
  case intValue:
    return value_.int_ >= minInt && value_.int_ <= maxInt;
  case uintValue:
    return value_.uint_ <= UInt(maxInt);
  case realValue:
    return value_.real_ >= minInt && value_.real_ <= maxInt &&
           IsIntegral(value_.real_);
  case stringValue:
    long int val;

    if (!converToInt (asString().c_str(), &val)) {
      break;
    }

    return IsInRange (val, minInt, maxInt);
  default:
    break;
  }
  return false;
}